

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

VRAnyCoreType __thiscall
MinVR::VRDataIndex::getValue(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  pointer pcVar1;
  size_type sVar2;
  iterator iVar3;
  VRAnyCoreType VVar4;
  VRError *this_00;
  long *plVar5;
  size_type *psVar6;
  int local_134;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (nameSpace->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + nameSpace->_M_string_length);
  iVar3 = _getEntry(this,key,&local_50,inherit);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar3._M_node != &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header) {
    VVar4.datum = (VRDatum_conflict *)(**(code **)(**(long **)(iVar3._M_node + 2) + 0x18))();
    return (VRAnyCoreType)VVar4.datum;
  }
  sVar2 = nameSpace->_M_string_length;
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  if (sVar2 == 0) {
    std::operator+(&local_90,"Never heard of ",key);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_130._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_130._M_dataplus._M_p == psVar6) {
      local_130.field_2._M_allocated_capacity = *psVar6;
      local_130.field_2._8_4_ = (undefined4)plVar5[3];
      local_130.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar6;
    }
    local_130._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.h"
               ,"");
    local_b0._M_dataplus._M_p._0_4_ = 0x27b;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "VRAnyCoreType MinVR::VRDataIndex::getValue(const std::string &, const std::string, const bool) const"
               ,"");
    VRError::VRError(this_00,&local_130,&local_f0,&local_d0,(int *)&local_b0,&local_110);
    __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
  }
  std::operator+(&local_d0,"Never heard of ",key);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar6) {
    local_f0.field_2._M_allocated_capacity = *psVar6;
    local_f0.field_2._8_8_ = plVar5[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar6;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::operator+(&local_90,&local_f0,nameSpace);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_130._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar6) {
    local_130.field_2._M_allocated_capacity = *psVar6;
    local_130.field_2._8_4_ = (undefined4)plVar5[3];
    local_130.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar6;
  }
  local_130._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.h"
             ,"");
  local_134 = 0x27d;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "VRAnyCoreType MinVR::VRDataIndex::getValue(const std::string &, const std::string, const bool) const"
             ,"");
  VRError::VRError(this_00,&local_130,&local_110,&local_b0,&local_134,&local_70);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRAnyCoreType getValue(const std::string &key,
                         const std::string nameSpace = "",
                         const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      if (nameSpace.empty()) {
        VRERRORNOADV("Never heard of " + key + ".");
      } else {
        VRERRORNOADV("Never heard of " + key + " in namespace " + nameSpace + ".");
      }
    } else {
      return p->second->getValue();
    }
  }